

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O0

ON__UINT32 on_random_number(ON_RANDOM_NUMBER_CONTEXT *randcontext)

{
  uint uVar1;
  uint local_14;
  ON__UINT32 y;
  ON__UINT32 kk;
  ON_RANDOM_NUMBER_CONTEXT *randcontext_local;
  
  if (0x26f < randcontext->mti) {
    if (0x270 < randcontext->mti) {
      on_random_number_seed(0x1571,randcontext);
    }
    for (local_14 = 0; local_14 < 0xe3; local_14 = local_14 + 1) {
      uVar1 = randcontext->mt[local_14] & 0x80000000 | randcontext->mt[local_14 + 1] & 0x7fffffff;
      randcontext->mt[local_14] =
           randcontext->mt[local_14 + 0x18d] ^ uVar1 >> 1 ^
           on_random_number::mag01[(ulong)uVar1 & 1];
    }
    for (; local_14 < 0x26f; local_14 = local_14 + 1) {
      uVar1 = randcontext->mt[local_14] & 0x80000000 | randcontext->mt[local_14 + 1] & 0x7fffffff;
      randcontext->mt[local_14] =
           randcontext->mt[local_14 - 0xe3] ^ uVar1 >> 1 ^ on_random_number::mag01[(ulong)uVar1 & 1]
      ;
    }
    uVar1 = randcontext->mt[0x26f] & 0x80000000 | randcontext->mt[0] & 0x7fffffff;
    randcontext->mt[0x26f] =
         randcontext->mt[0x18c] ^ uVar1 >> 1 ^ on_random_number::mag01[(ulong)uVar1 & 1];
    randcontext->mti = 0;
  }
  uVar1 = randcontext->mti;
  randcontext->mti = uVar1 + 1;
  uVar1 = randcontext->mt[uVar1] >> 0xb ^ randcontext->mt[uVar1];
  uVar1 = uVar1 ^ (uVar1 & 0x13a58ad) << 7;
  uVar1 = uVar1 ^ (uVar1 & 0x1df8c) << 0xf;
  return uVar1 >> 0x12 ^ uVar1;
}

Assistant:

ON__UINT32 on_random_number(struct ON_RANDOM_NUMBER_CONTEXT* randcontext)
{
  static const ON__UINT32 mag01[2]={0x0UL, MATRIX_A};
  ON__UINT32 kk, y;
  /* mag01[x] = x * MATRIX_A  for x=0,1 */

  if (randcontext->mti >= N) 
  {
    /* generate N words at one time */
    if (randcontext->mti >= N+1)
    {
      /* if randcontext has never been initialized */
      on_random_number_seed(5489UL,randcontext); /* a default initial seed is used */
    }

    for (kk=0;kk<N-M;kk++)
    {
      y = (randcontext->mt[kk]&UPPER_MASK)|(randcontext->mt[kk+1]&LOWER_MASK);
      randcontext->mt[kk] = randcontext->mt[kk+M] ^ (y >> 1) ^ mag01[y & 0x1UL];
    }
    for (;kk<N-1;kk++) 
    {
      y = (randcontext->mt[kk]&UPPER_MASK)|(randcontext->mt[kk+1]&LOWER_MASK);
      randcontext->mt[kk] = randcontext->mt[kk+(M-N)] ^ (y >> 1) ^ mag01[y & 0x1UL];
    }
    y = (randcontext->mt[N-1]&UPPER_MASK)|(randcontext->mt[0]&LOWER_MASK);
    randcontext->mt[N-1] = randcontext->mt[M-1] ^ (y >> 1) ^ mag01[y & 0x1UL];

    randcontext->mti = 0;
  }

  y = randcontext->mt[randcontext->mti++];

  /* Tempering */
  y ^= (y >> 11);
  y ^= (y << 7) & 0x9d2c5680UL;
  y ^= (y << 15) & 0xefc60000UL;
  y ^= (y >> 18);

  return y;
}